

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O3

void onquest(void)

{
  boolean bVar1;
  s_level *psVar2;
  int msgnum;
  
  if ((u.uevent._0_1_ & 0x20) == 0) {
    bVar1 = on_level(&u.uz0,&u.uz);
    if (bVar1 == '\0') {
      psVar2 = Is_special(&u.uz);
      if (psVar2 != (s_level *)0x0) {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
        if (bVar1 == '\0') {
          bVar1 = on_level(&u.uz,&dungeon_topology.d_qlocate_level);
          if ((bVar1 != '\0') && (u.uz0.dlevel < u.uz.dlevel)) {
            on_locate();
            return;
          }
          bVar1 = on_level(&u.uz,&dungeon_topology.d_nemesis_level);
          if (bVar1 != '\0') {
            on_goal();
            return;
          }
        }
        else if ((quest_status._0_4_ & 1) == 0) {
          qt_pager(1);
          quest_status._0_4_ = quest_status._0_4_ | 1;
        }
        else if ((u.uz0.dnum != u.uz.dnum) || (u.uz0.dlevel < u.uz.dlevel)) {
          if ((quest_status._0_4_ & 0x1c) < 0xc) {
            msgnum = 2;
          }
          else {
            msgnum = 3;
          }
          qt_pager(msgnum);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void onquest(void)
{
	if (u.uevent.qcompleted || Not_firsttime) return;
	if (!Is_special(&u.uz)) return;

	if (Is_qstart(&u.uz)) on_start();
	else if (Is_qlocate(&u.uz) && u.uz.dlevel > u.uz0.dlevel) on_locate();
	else if (Is_nemesis(&u.uz)) on_goal();
	return;
}